

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O2

string * cmSearchPathStripBin(string *__return_storage_ptr__,string *s)

{
  bool bVar1;
  string_view str;
  string_view str_00;
  
  str._M_str = (s->_M_dataplus)._M_p;
  str._M_len = s->_M_string_length;
  bVar1 = cmHasLiteralSuffix<5ul>(str,(char (*) [5])0x5db3c6);
  if ((!bVar1) &&
     (str_00._M_str = (s->_M_dataplus)._M_p, str_00._M_len = s->_M_string_length,
     bVar1 = cmHasLiteralSuffix<6ul>(str_00,(char (*) [6])0x5fe111), !bVar1)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
    return __return_storage_ptr__;
  }
  cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

static std::string cmSearchPathStripBin(std::string const& s)
{
  // If the path is a PREFIX/bin case then add its parent instead.
  if ((cmHasLiteralSuffix(s, "/bin")) || (cmHasLiteralSuffix(s, "/sbin"))) {
    return cmSystemTools::GetFilenamePath(s);
  }
  return s;
}